

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module_instrumentation.cpp
# Opt level: O2

Id dxil_spv::build_allocate_invocation_id_function
             (SPIRVModule *module,uint32_t desc_set,uint32_t binding)

{
  Block *pBVar1;
  Id IVar2;
  Id IVar3;
  Id IVar4;
  Builder *this;
  Function *pFVar5;
  Instruction *pIVar6;
  Instruction *pIVar7;
  uint32_t in_stack_ffffffffffffff80;
  Block *entry;
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  local_68;
  _Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_48;
  
  this = SPIRVModule::get_builder(module);
  pBVar1 = this->buildPoint;
  entry = (Block *)0x0;
  IVar2 = spv::Builder::makeUintType(this,0x20);
  IVar3 = build_instrumentation_ssbo
                    (module,IVar2,4,"BloomBufferInvocationSSBO","BloomBufferInvocation",
                     (char *)(ulong)desc_set,binding,in_stack_ffffffffffffff80);
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pFVar5 = spv::Builder::makeFunctionEntry
                     (this,DecorationMax,IVar2,"AllocateInvocationID",(Vector<Id> *)&local_48,
                      &local_68,&entry);
  std::
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ::~vector(&local_68);
  std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
            (&local_48);
  pIVar6 = spv::Builder::addInstruction(this,IVar2,OpArrayLength);
  spv::Instruction::addIdOperand(pIVar6,IVar3);
  spv::Instruction::addImmediateOperand(pIVar6,0);
  pIVar7 = spv::Builder::addInstruction(this,IVar2,OpISub);
  spv::Instruction::addIdOperand(pIVar7,pIVar6->resultId);
  IVar4 = spv::Builder::makeUintConstant(this,1,false);
  spv::Instruction::addIdOperand(pIVar7,IVar4);
  IVar4 = spv::Builder::makePointer(this,StorageClassStorageBuffer,IVar2);
  pIVar6 = spv::Builder::addInstruction(this,IVar4,OpAccessChain);
  spv::Instruction::addIdOperand(pIVar6,IVar3);
  IVar3 = spv::Builder::makeUintConstant(this,0,false);
  spv::Instruction::addIdOperand(pIVar6,IVar3);
  spv::Instruction::addIdOperand(pIVar6,pIVar7->resultId);
  pIVar7 = spv::Builder::addInstruction(this,IVar2,OpAtomicIAdd);
  spv::Instruction::addIdOperand(pIVar7,pIVar6->resultId);
  IVar2 = spv::Builder::makeUintConstant(this,1,false);
  spv::Instruction::addIdOperand(pIVar7,IVar2);
  IVar2 = spv::Builder::makeUintConstant(this,0,false);
  spv::Instruction::addIdOperand(pIVar7,IVar2);
  IVar2 = spv::Builder::makeUintConstant(this,0x41c81b37,false);
  spv::Instruction::addIdOperand(pIVar7,IVar2);
  spv::Builder::makeReturn(this,false,pIVar7->resultId);
  this->buildPoint = pBVar1;
  return (pFVar5->functionInstruction).resultId;
}

Assistant:

spv::Id build_allocate_invocation_id_function(SPIRVModule &module, uint32_t desc_set, uint32_t binding)
{
	auto &builder = module.get_builder();
	auto *current_build_point = builder.getBuildPoint();
	spv::Block *entry = nullptr;
	spv::Id uint_type = builder.makeUintType(32);

	spv::Id bloom_var_id = build_instrumentation_ssbo(
		module, uint_type, 4, "atomics", "BloomBufferInvocationSSBO", "BloomBufferInvocation", desc_set, binding);

	auto *func = builder.makeFunctionEntry(spv::NoPrecision, uint_type, "AllocateInvocationID",
	                                       {}, {}, &entry);

	auto *len = builder.addInstruction(uint_type, spv::OpArrayLength);
	len->addIdOperand(bloom_var_id);
	len->addImmediateOperand(0);

	auto *len_minus_1 = builder.addInstruction(uint_type, spv::OpISub);
	len_minus_1->addIdOperand(len->getResultId());
	len_minus_1->addIdOperand(builder.makeUintConstant(1));

	auto *chain = builder.addInstruction(builder.makePointer(spv::StorageClassStorageBuffer, uint_type), spv::OpAccessChain);
	chain->addIdOperand(bloom_var_id);
	chain->addIdOperand(builder.makeUintConstant(0));
	chain->addIdOperand(len_minus_1->getResultId());

	auto *atomic_add = builder.addInstruction(uint_type, spv::OpAtomicIAdd);
	atomic_add->addIdOperand(chain->getResultId());
	atomic_add->addIdOperand(builder.makeUintConstant(spv::ScopeDevice));
	atomic_add->addIdOperand(builder.makeUintConstant(0));
	atomic_add->addIdOperand(builder.makeUintConstant(1103633207u));

	builder.makeReturn(false, atomic_add->getResultId());
	builder.setBuildPoint(current_build_point);
	return func->getId();
}